

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  bool bVar1;
  BlockExprBase<(wabt::ExprType)7> *pBVar2;
  BlockExprBase<(wabt::ExprType)22> *pBVar3;
  IfExpr *pIVar4;
  IfExceptExpr *pIVar5;
  TryExpr *pTVar6;
  Location local_110;
  Location local_f0;
  Location local_d0;
  Location local_b0;
  Location local_90;
  Location local_70;
  Location local_50;
  Enum local_2c;
  Expr *local_28;
  Expr *expr;
  LabelNode *label;
  BinaryReaderIR *this_local;
  
  label = (LabelNode *)this;
  local_2c = (Enum)TopLabelExpr(this,(LabelNode **)&expr,&local_28);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    switch(*(undefined4 *)&expr->_vptr_Expr) {
    case 0:
    case 8:
      break;
    case 1:
      GetLocation(&local_50,this);
      pBVar2 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(local_28);
      (pBVar2->block).end_loc.filename.data_ = local_50.filename.data_;
      (pBVar2->block).end_loc.filename.size_ = local_50.filename.size_;
      (pBVar2->block).end_loc.field_1.field_1.offset = (size_t)local_50.field_1.field_1.offset;
      *(undefined8 *)((long)&(pBVar2->block).end_loc.field_1 + 8) = local_50.field_1._8_8_;
      break;
    case 2:
      GetLocation(&local_70,this);
      pBVar3 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(local_28);
      (pBVar3->block).end_loc.filename.data_ = local_70.filename.data_;
      (pBVar3->block).end_loc.filename.size_ = local_70.filename.size_;
      (pBVar3->block).end_loc.field_1.field_1.offset = (size_t)local_70.field_1.field_1.offset;
      *(undefined8 *)((long)&(pBVar3->block).end_loc.field_1 + 8) = local_70.field_1._8_8_;
      break;
    case 3:
      GetLocation(&local_90,this);
      pIVar4 = cast<wabt::IfExpr,wabt::Expr>(local_28);
      (pIVar4->true_).end_loc.filename.data_ = local_90.filename.data_;
      (pIVar4->true_).end_loc.filename.size_ = local_90.filename.size_;
      (pIVar4->true_).end_loc.field_1.field_1.offset = (size_t)local_90.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar4->true_).end_loc.field_1 + 8) = local_90.field_1._8_8_;
      break;
    case 4:
      GetLocation(&local_b0,this);
      pIVar4 = cast<wabt::IfExpr,wabt::Expr>(local_28);
      (pIVar4->false_end_loc).filename.data_ = local_b0.filename.data_;
      (pIVar4->false_end_loc).filename.size_ = local_b0.filename.size_;
      (pIVar4->false_end_loc).field_1.field_1.offset = (size_t)local_b0.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar4->false_end_loc).field_1 + 8) = local_b0.field_1._8_8_;
      break;
    case 5:
      GetLocation(&local_d0,this);
      pIVar5 = cast<wabt::IfExceptExpr,wabt::Expr>(local_28);
      (pIVar5->true_).end_loc.filename.data_ = local_d0.filename.data_;
      (pIVar5->true_).end_loc.filename.size_ = local_d0.filename.size_;
      (pIVar5->true_).end_loc.field_1.field_1.offset = (size_t)local_d0.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar5->true_).end_loc.field_1 + 8) = local_d0.field_1._8_8_;
      break;
    case 6:
      GetLocation(&local_f0,this);
      pIVar5 = cast<wabt::IfExceptExpr,wabt::Expr>(local_28);
      (pIVar5->false_end_loc).filename.data_ = local_f0.filename.data_;
      (pIVar5->false_end_loc).filename.size_ = local_f0.filename.size_;
      (pIVar5->false_end_loc).field_1.field_1.offset = (size_t)local_f0.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar5->false_end_loc).field_1 + 8) = local_f0.field_1._8_8_;
      break;
    case 7:
      GetLocation(&local_110,this);
      pTVar6 = cast<wabt::TryExpr,wabt::Expr>(local_28);
      (pTVar6->block).end_loc.filename.data_ = local_110.filename.data_;
      (pTVar6->block).end_loc.filename.size_ = local_110.filename.size_;
      (pTVar6->block).end_loc.field_1.field_1.offset = (size_t)local_110.field_1.field_1.offset;
      *(undefined8 *)((long)&(pTVar6->block).end_loc.field_1 + 8) = local_110.field_1._8_8_;
    }
    this_local._4_4_ = PopLabel(this);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));
  switch (label->label_type) {
    case LabelType::Block:
      cast<BlockExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::Loop:
      cast<LoopExpr>(expr)->block.end_loc = GetLocation();
      break;
    case LabelType::If:
      cast<IfExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::Else:
      cast<IfExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::IfExcept:
      cast<IfExceptExpr>(expr)->true_.end_loc = GetLocation();
      break;
    case LabelType::IfExceptElse:
      cast<IfExceptExpr>(expr)->false_end_loc = GetLocation();
      break;
    case LabelType::Try:
      cast<TryExpr>(expr)->block.end_loc = GetLocation();
      break;

    case LabelType::Func:
    case LabelType::Catch:
      break;
  }

  return PopLabel();
}